

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPSources::ProcessRawPacket
          (RTPSources *this,RTPRawPacket *rawpack,RTPTransmitter **rtptrans,int numtrans,
          bool acceptownpackets)

{
  int iVar1;
  uint uVar2;
  RTPPacket *this_00;
  _func_int **pp_Var3;
  RTPAddress *senderaddress;
  RTPMemoryManager *pRVar4;
  RTPAddress *pRVar5;
  undefined7 in_register_00000081;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  bool stored;
  RTCPCompoundPacket rtcpcomppack;
  RTPTime local_a8;
  RTPRawPacket *local_a0;
  undefined4 local_94;
  RTPSources *local_90;
  RTPPacket *local_88;
  RTCPCompoundPacket local_80;
  
  local_94 = (undefined4)CONCAT71(in_register_00000081,acceptownpackets);
  if (rawpack->isrtp != true) {
    RTCPCompoundPacket::RTCPCompoundPacket(&local_80,rawpack,(this->super_RTPMemoryObject).mgr);
    if (local_80.error < 0) {
      uVar2 = local_80.error;
      if (local_80.error == 0xffffffe2) goto LAB_0011e32a;
LAB_0011e320:
      bVar7 = false;
    }
    else {
      if (numtrans < 1) {
LAB_0011e2a5:
        local_a8.m_t = (rawpack->receivetime).m_t;
        uVar2 = ProcessRTCPCompoundPacket(this,&local_80,&local_a8,rawpack->senderaddress);
LAB_0011e2c3:
        if (-1 < (int)uVar2) goto LAB_0011e2c9;
        bVar7 = false;
      }
      else {
        pRVar5 = rawpack->senderaddress;
        uVar2 = 0;
        uVar6 = 1;
        local_a0 = rawpack;
        local_90 = this;
        do {
          iVar1 = (*(rtptrans[uVar6 - 1]->super_RTPMemoryObject)._vptr_RTPMemoryObject[8])
                            (rtptrans[uVar6 - 1],pRVar5);
          if ((char)iVar1 != '\0') {
            uVar2 = 1;
          }
        } while ((uVar2 == 0) && (bVar7 = uVar6 < (uint)numtrans, uVar6 = uVar6 + 1, bVar7));
        this = local_90;
        rawpack = local_a0;
        if (uVar2 == 0) goto LAB_0011e2a5;
        if ((char)local_94 != '\0') {
          local_a8.m_t = (local_a0->receivetime).m_t;
          uVar2 = ProcessRTCPCompoundPacket(local_90,&local_80,&local_a8,(RTPAddress *)0x0);
          goto LAB_0011e2c3;
        }
LAB_0011e2c9:
        bVar7 = true;
      }
      if (!bVar7) goto LAB_0011e320;
LAB_0011e32a:
      bVar7 = true;
    }
    RTCPCompoundPacket::~RTCPCompoundPacket(&local_80);
    goto joined_r0x0011e338;
  }
  pRVar4 = (this->super_RTPMemoryObject).mgr;
  if (pRVar4 == (RTPMemoryManager *)0x0) {
    local_a0 = rawpack;
    this_00 = (RTPPacket *)operator_new(0x78);
  }
  else {
    local_a0 = rawpack;
    this_00 = (RTPPacket *)(**(code **)(*(long *)pRVar4 + 0x10))(pRVar4,0x78,0x19);
  }
  RTPPacket::RTPPacket(this_00,local_a0,(this->super_RTPMemoryObject).mgr);
  uVar2 = this_00->error;
  pRVar5 = (RTPAddress *)(ulong)uVar2;
  if ((int)uVar2 < 0) {
    pRVar4 = (this->super_RTPMemoryObject).mgr;
    pp_Var3 = (this_00->super_RTPMemoryObject)._vptr_RTPMemoryObject;
    if (uVar2 == 0xffffffe7) {
      if (pRVar4 == (RTPMemoryManager *)0x0) {
        (*pp_Var3[1])(this_00);
      }
      else {
        (**pp_Var3)(this_00);
        (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,this_00);
      }
      this_00 = (RTPPacket *)0x0;
      goto LAB_0011e34c;
    }
LAB_0011e44f:
    if (pRVar4 == (RTPMemoryManager *)0x0) {
      (*pp_Var3[1])(this_00);
    }
    else {
      (**pp_Var3)(this_00);
      (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,this_00);
    }
LAB_0011e46d:
    bVar7 = false;
  }
  else {
LAB_0011e34c:
    if (this_00 != (RTPPacket *)0x0) {
      local_a8.m_t = local_a8.m_t & 0xffffffffffffff00;
      pRVar5 = local_a0->senderaddress;
      if (numtrans < 1) {
LAB_0011e3e5:
        local_80.super_RTPMemoryObject._vptr_RTPMemoryObject =
             (_func_int **)(local_a0->receivetime).m_t;
        senderaddress = pRVar5;
LAB_0011e404:
        uVar2 = ProcessRTPPacket(this,this_00,(RTPTime *)&local_80,senderaddress,(bool *)&local_a8);
        if ((int)uVar2 < 0) {
          if (local_a8.m_t._0_1_ == '\0') {
            pRVar4 = (this->super_RTPMemoryObject).mgr;
            pp_Var3 = (this_00->super_RTPMemoryObject)._vptr_RTPMemoryObject;
            goto LAB_0011e44f;
          }
          goto LAB_0011e46d;
        }
      }
      else {
        bVar7 = false;
        uVar6 = 1;
        local_90 = this;
        local_88 = this_00;
        do {
          iVar1 = (*(rtptrans[uVar6 - 1]->super_RTPMemoryObject)._vptr_RTPMemoryObject[8])
                            (rtptrans[uVar6 - 1],pRVar5);
          if ((char)iVar1 != '\0') {
            bVar7 = true;
          }
        } while ((!bVar7) && (bVar8 = uVar6 < (uint)numtrans, uVar6 = uVar6 + 1, bVar8));
        this = local_90;
        this_00 = local_88;
        if (!bVar7) goto LAB_0011e3e5;
        if ((char)local_94 != '\0') {
          local_80.super_RTPMemoryObject._vptr_RTPMemoryObject =
               (_func_int **)(local_a0->receivetime).m_t;
          senderaddress = (RTPAddress *)0x0;
          goto LAB_0011e404;
        }
      }
      if (local_a8.m_t._0_1_ == '\0') {
        pRVar4 = (this->super_RTPMemoryObject).mgr;
        pp_Var3 = (this_00->super_RTPMemoryObject)._vptr_RTPMemoryObject;
        if (pRVar4 == (RTPMemoryManager *)0x0) {
          (*pp_Var3[1])(this_00);
        }
        else {
          (**pp_Var3)(this_00);
          (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,this_00);
        }
      }
    }
    uVar2 = (uint)pRVar5;
    bVar7 = true;
  }
joined_r0x0011e338:
  if (bVar7) {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

int RTPSources::ProcessRawPacket(RTPRawPacket *rawpack,RTPTransmitter *rtptrans[],int numtrans,bool acceptownpackets)
{
	int status;
	
	if (rawpack->IsRTP()) // RTP packet
	{
		RTPPacket *rtppack;
		
		// First, we'll see if the packet can be parsed
		rtppack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPPACKET) RTPPacket(*rawpack,GetMemoryManager());
		if (rtppack == 0)
			return ERR_RTP_OUTOFMEM;
		if ((status = rtppack->GetCreationError()) < 0)
		{
			if (status == ERR_RTP_PACKET_INVALIDPACKET)
			{
				RTPDelete(rtppack,GetMemoryManager());
				rtppack = 0;
			}
			else
			{
				RTPDelete(rtppack,GetMemoryManager());
				return status;
			}
		}
				
		// Check if the packet was valid
		if (rtppack != 0)
		{
			bool stored = false;
			bool ownpacket = false;
			int i;
			const RTPAddress *senderaddress = rawpack->GetSenderAddress();

			for (i = 0 ; !ownpacket && i < numtrans ; i++)
			{
				if (rtptrans[i]->ComesFromThisTransmitter(senderaddress))
					ownpacket = true;
			}
			
			// Check if the packet is our own.
			if (ownpacket)
			{
				// Now it depends on the user's preference
				// what to do with this packet:
				if (acceptownpackets)
				{
					// sender addres for own packets has to be NULL!
					if ((status = ProcessRTPPacket(rtppack,rawpack->GetReceiveTime(),0,&stored)) < 0)
					{
						if (!stored)
							RTPDelete(rtppack,GetMemoryManager());
						return status;
					}
				}
			}
			else 
			{
				if ((status = ProcessRTPPacket(rtppack,rawpack->GetReceiveTime(),senderaddress,&stored)) < 0)
				{
					if (!stored)
						RTPDelete(rtppack,GetMemoryManager());
					return status;
				}
			}
			if (!stored)
				RTPDelete(rtppack,GetMemoryManager());
		}
	}
	else // RTCP packet
	{
		RTCPCompoundPacket rtcpcomppack(*rawpack,GetMemoryManager());
		bool valid = false;
		
		if ((status = rtcpcomppack.GetCreationError()) < 0)
		{
			if (status != ERR_RTP_RTCPCOMPOUND_INVALIDPACKET)
				return status;
		}
		else
			valid = true;


		if (valid)
		{
			bool ownpacket = false;
			int i;
			const RTPAddress *senderaddress = rawpack->GetSenderAddress();

			for (i = 0 ; !ownpacket && i < numtrans ; i++)
			{
				if (rtptrans[i]->ComesFromThisTransmitter(senderaddress))
					ownpacket = true;
			}

			// First check if it's a packet of this session.
			if (ownpacket)
			{
				if (acceptownpackets)
				{
					// sender address for own packets has to be NULL
					status = ProcessRTCPCompoundPacket(&rtcpcomppack,rawpack->GetReceiveTime(),0);
					if (status < 0)
						return status;
				}
			}
			else // not our own packet
			{
				status = ProcessRTCPCompoundPacket(&rtcpcomppack,rawpack->GetReceiveTime(),rawpack->GetSenderAddress());
				if (status < 0)
					return status;
			}
		}
	}
	
	return 0;
}